

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_parse_for_in_of(JSParseState *s,int label_name,BOOL is_async)

{
  size_t sVar1;
  size_t sVar2;
  JSAtomStruct *pJVar3;
  JSFunctionDef *pJVar4;
  JSFunctionDef *pJVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  uint8_t uVar12;
  int *piVar13;
  JSAtom name;
  char *pcVar14;
  JSContext *pJVar15;
  bool bVar16;
  JSAtom var_name;
  int local_9c;
  int local_98;
  int local_94;
  BOOL local_90;
  int skip_bits;
  JSFunctionDef *local_88;
  JSContext *local_80;
  int local_78;
  int opcode;
  DynBuf *local_70;
  int local_64;
  int lvalue_label;
  int scope;
  BlockEnv break_entry;
  
  local_80 = s->ctx;
  local_88 = s->cur_func;
  iVar10 = local_88->scope_level;
  local_90 = is_async;
  iVar7 = new_label_fd(local_88,-1);
  local_78 = new_label_fd(s->cur_func,-1);
  iVar8 = new_label_fd(s->cur_func,-1);
  iVar9 = new_label_fd(s->cur_func,-1);
  push_scope(s);
  break_entry.prev = s->cur_func->top_break;
  s->cur_func->top_break = &break_entry;
  break_entry.drop_count = 1;
  break_entry.label_finally = -1;
  break_entry.has_iterator = 0;
  local_98 = iVar7;
  local_94 = iVar10;
  break_entry.label_name = label_name;
  break_entry.label_break = iVar8;
  break_entry.label_cont = iVar7;
  break_entry.scope_level = iVar10;
  iVar7 = emit_goto(s,0x6b,-1);
  sVar1 = (s->cur_func->byte_code).size;
  local_64 = iVar9;
  emit_label(s,iVar9);
  iVar10 = (s->token).val;
  iVar9 = is_let(s,4);
  if (iVar9 != 0) {
    if (iVar9 != 1) {
      return -1;
    }
    iVar10 = -0x2f;
  }
  if ((iVar10 + 0x4fU < 0x21) && ((0x101000001U >> ((ulong)(iVar10 + 0x4fU) & 0x3f) & 1) != 0)) {
    iVar9 = next_token(s);
    if (iVar9 != 0) {
      return -1;
    }
    iVar9 = (s->token).val;
    if ((iVar9 != 0x7b) && (iVar9 != 0x5b)) {
      if ((iVar9 != -0x7d) || ((s->token).u.ident.is_reserved != 0)) {
        pcVar14 = "variable name expected";
        goto LAB_0015fdf0;
      }
      name = (s->token).u.ident.atom;
      if (0xd1 < (long)(int)name) {
        pJVar3 = local_80->rt->atom_array[(int)name];
        (pJVar3->header).ref_count = (pJVar3->header).ref_count + 1;
      }
      var_name = name;
      iVar9 = next_token(s);
      if ((iVar9 != 0) || (iVar9 = js_define_var(s,name,iVar10), iVar9 != 0)) {
        pJVar15 = s->ctx;
        goto LAB_0015fd28;
      }
      local_9c = iVar8;
      emit_op(s,((iVar10 + 0x37U & 0xfffffff7) == 0) * '\x04' + 0xb7);
      emit_atom(s,name);
      opcode = CONCAT22(opcode._2_2_,(short)local_88->scope_level);
      dbuf_put(&s->cur_func->byte_code,(uint8_t *)&opcode,2);
      goto LAB_0015fc73;
    }
    local_9c = iVar8;
    iVar8 = js_parse_destructuring_element(s,iVar10,0,1,-1,0);
    if (iVar8 < 0) {
      return -1;
    }
    var_name = 0;
    bVar6 = 1;
  }
  else {
    if ((((s->token).val | 0x20U) == 0x7b) &&
       ((iVar9 = js_parse_skip_parens_token(s,&skip_bits,0), iVar9 == -0x27 || (iVar9 == -0x49)))) {
      iVar9 = js_parse_destructuring_element(s,0,0,1,skip_bits & 2,1);
      if (iVar9 < 0) {
        return -1;
      }
    }
    else {
      iVar9 = js_parse_postfix_expr(s,2);
      if (iVar9 != 0) {
        return -1;
      }
      iVar9 = get_lvalue(s,&opcode,&scope,&var_name,&lvalue_label,(int *)0x0,0,-0x45);
      if (iVar9 != 0) {
        return -1;
      }
      put_lvalue(s,opcode,scope,var_name,lvalue_label,PUT_LVALUE_NOKEEP_BOTTOM,0);
    }
    var_name = 0;
    local_9c = iVar8;
LAB_0015fc73:
    bVar6 = 0;
  }
  emit_goto(s,0x6b,local_78);
  sVar2 = (s->cur_func->byte_code).size;
  emit_label(s,iVar7);
  iVar7 = (s->token).val;
  if (iVar7 == 0x3d) {
    iVar8 = next_token(s);
    pJVar15 = local_80;
    name = var_name;
    if ((iVar8 != 0) ||
       (iVar8 = js_parse_assign_expr2(s,0), pJVar15 = local_80, name = var_name, iVar8 != 0)) {
LAB_0015fd28:
      JS_FreeAtom(pJVar15,name);
      return -1;
    }
    if (var_name != 0) {
      local_70 = (DynBuf *)CONCAT44(local_70._4_4_,var_name);
      emit_op(s,0xb7);
      emit_atom(s,(JSAtom)local_70);
      skip_bits = CONCAT22(skip_bits._2_2_,(short)local_88->scope_level);
      dbuf_put(&s->cur_func->byte_code,(uint8_t *)&skip_bits,2);
    }
  }
  JS_FreeAtom(local_80,var_name);
  iVar8 = (s->token).val;
  bVar16 = true;
  if ((iVar8 == -0x7d) && ((s->token).u.ident.atom == 0x43)) {
    bVar16 = (s->token).u.ident.has_escape != 0;
  }
  if (bVar16) {
    if (iVar8 == -0x49) {
      if (local_90 == 0) {
        if ((iVar7 == 0x3d) &&
           ((pcVar14 = "in", iVar10 != -0x4f || (!(bool)(~bVar6 & (local_88->js_mode & 1) == 0)))))
        goto LAB_0015fdd6;
        goto LAB_0015fe3b;
      }
      pcVar14 = "\'for await\' loop should be used with \'of\'";
    }
    else {
      pcVar14 = "expected \'of\' or \'in\' in for control expression";
    }
LAB_0015fdf0:
    js_parse_error(s,pcVar14);
    return -1;
  }
  break_entry.drop_count = break_entry.drop_count + 2;
  break_entry.has_iterator = 1;
  if (iVar7 == 0x3d) {
    pcVar14 = "of";
LAB_0015fdd6:
    js_parse_error(s,"a declaration in the head of a for-%s loop can\'t have an initializer",pcVar14
                  );
    return -1;
  }
LAB_0015fe3b:
  iVar10 = next_token(s);
  if (iVar10 != 0) {
    return -1;
  }
  if (bVar16) {
    iVar10 = js_parse_expr2(s,1);
  }
  else {
    iVar10 = js_parse_assign_expr2(s,1);
  }
  if (iVar10 != 0) {
    return -1;
  }
  close_scopes(s,s->cur_func->scope_level,local_94);
  uVar12 = '|';
  if (!bVar16) {
    uVar12 = '~' - (local_90 == 0);
  }
  emit_op(s,uVar12);
  emit_goto(s,0x6b,local_98);
  iVar10 = js_parse_expect(s,0x29);
  if (iVar10 != 0) {
    return -1;
  }
  pJVar4 = s->cur_func;
  local_70 = &pJVar4->byte_code;
  iVar10 = (int)sVar2;
  iVar7 = (int)sVar1;
  sVar2 = (pJVar4->byte_code).size;
  local_88 = (JSFunctionDef *)(long)(iVar10 - iVar7);
  local_80 = (JSContext *)sVar1;
  dbuf_realloc(local_70,sVar2 + (long)local_88);
  dbuf_put(local_70,(pJVar4->byte_code).buf + iVar7,(size_t)local_88);
  pJVar15 = local_80;
  memset((pJVar4->byte_code).buf + iVar7,0xb1,(size_t)local_88);
  pJVar5 = s->cur_func;
  pJVar5->last_opcode_pos = (int)(pJVar4->byte_code).size + -5;
  if (local_98 < pJVar5->label_count) {
    piVar13 = &pJVar5->label_slots[local_98].pos;
    lVar11 = (long)pJVar5->label_count - (long)local_98;
    do {
      iVar7 = *piVar13;
      if (((int)pJVar15 <= iVar7) && (iVar7 < iVar10)) {
        *piVar13 = iVar7 + ((int)sVar2 - (int)pJVar15);
      }
      piVar13 = piVar13 + 6;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  emit_label(s,local_78);
  iVar10 = js_parse_statement_or_decl(s,0);
  if (iVar10 == 0) {
    close_scopes(s,s->cur_func->scope_level,local_94);
    emit_label(s,local_98);
    iVar10 = local_9c;
    if (bVar16) {
      emit_op(s,'\x7f');
      uVar12 = '\x0e';
      iVar10 = local_9c;
    }
    else {
      if (local_90 == 0) {
        emit_op(s,0x80);
        dbuf_putc(&s->cur_func->byte_code,'\0');
      }
      else {
        emit_op(s,'\x14');
        emit_op(s,'\x0e');
        emit_op(s,'$');
        skip_bits = skip_bits & 0xffff0000;
        dbuf_put(&s->cur_func->byte_code,(uint8_t *)&skip_bits,2);
        emit_op(s,0x8b);
        emit_op(s,0x82);
      }
      uVar12 = 0x83;
    }
    emit_goto(s,0x69,local_64);
    emit_op(s,'\x0e');
    emit_label(s,iVar10);
    emit_op(s,uVar12);
    s->cur_func->top_break = s->cur_func->top_break->prev;
    pop_scope(s);
    return 0;
  }
  return -1;
}

Assistant:

static __exception int js_parse_for_in_of(JSParseState *s, int label_name,
                                          BOOL is_async)
{
    JSContext *ctx = s->ctx;
    JSFunctionDef *fd = s->cur_func;
    JSAtom var_name;
    BOOL has_initializer, is_for_of, has_destructuring;
    int tok, tok1, opcode, scope, block_scope_level;
    int label_next, label_expr, label_cont, label_body, label_break;
    int pos_next, pos_expr;
    BlockEnv break_entry;

    has_initializer = FALSE;
    has_destructuring = FALSE;
    is_for_of = FALSE;
    block_scope_level = fd->scope_level;
    label_cont = new_label(s);
    label_body = new_label(s);
    label_break = new_label(s);
    label_next = new_label(s);

    /* create scope for the lexical variables declared in the enumeration
       expressions. XXX: Not completely correct because of weird capturing
       semantics in `for (i of o) a.push(function(){return i})` */
    push_scope(s);

    /* local for_in scope starts here so individual elements
       can be closed in statement. */
    push_break_entry(s->cur_func, &break_entry,
                     label_name, label_break, label_cont, 1);
    break_entry.scope_level = block_scope_level;

    label_expr = emit_goto(s, OP_goto, -1);

    pos_next = s->cur_func->byte_code.size;
    emit_label(s, label_next);

    tok = s->token.val;
    switch (is_let(s, DECL_MASK_OTHER)) {
    case TRUE:
        tok = TOK_LET;
        break;
    case FALSE:
        break;
    default:
        return -1;
    }
    if (tok == TOK_VAR || tok == TOK_LET || tok == TOK_CONST) {
        if (next_token(s))
            return -1;

        if (!(s->token.val == TOK_IDENT && !s->token.u.ident.is_reserved)) {
            if (s->token.val == '[' || s->token.val == '{') {
                if (js_parse_destructuring_element(s, tok, 0, TRUE, -1, FALSE) < 0)
                    return -1;
                has_destructuring = TRUE;
            } else {
                return js_parse_error(s, "variable name expected");
            }
            var_name = JS_ATOM_NULL;
        } else {
            var_name = JS_DupAtom(ctx, s->token.u.ident.atom);
            if (next_token(s)) {
                JS_FreeAtom(s->ctx, var_name);
                return -1;
            }
            if (js_define_var(s, var_name, tok)) {
                JS_FreeAtom(s->ctx, var_name);
                return -1;
            }
            emit_op(s, (tok == TOK_CONST || tok == TOK_LET) ?
                    OP_scope_put_var_init : OP_scope_put_var);
            emit_atom(s, var_name);
            emit_u16(s, fd->scope_level);
        }
    } else {
        int skip_bits;
        if ((s->token.val == '[' || s->token.val == '{')
        &&  ((tok1 = js_parse_skip_parens_token(s, &skip_bits, FALSE)) == TOK_IN || tok1 == TOK_OF)) {
            if (js_parse_destructuring_element(s, 0, 0, TRUE, skip_bits & SKIP_HAS_ELLIPSIS, TRUE) < 0)
                return -1;
        } else {
            int lvalue_label;
            if (js_parse_left_hand_side_expr(s))
                return -1;
            if (get_lvalue(s, &opcode, &scope, &var_name, &lvalue_label,
                           NULL, FALSE, TOK_FOR))
                return -1;
            put_lvalue(s, opcode, scope, var_name, lvalue_label,
                       PUT_LVALUE_NOKEEP_BOTTOM, FALSE);
        }
        var_name = JS_ATOM_NULL;
    }
    emit_goto(s, OP_goto, label_body);

    pos_expr = s->cur_func->byte_code.size;
    emit_label(s, label_expr);
    if (s->token.val == '=') {
        /* XXX: potential scoping issue if inside `with` statement */
        has_initializer = TRUE;
        /* parse and evaluate initializer prior to evaluating the
           object (only used with "for in" with a non lexical variable
           in non strict mode */
        if (next_token(s) || js_parse_assign_expr2(s, 0)) {
            JS_FreeAtom(ctx, var_name);
            return -1;
        }
        if (var_name != JS_ATOM_NULL) {
            emit_op(s, OP_scope_put_var);
            emit_atom(s, var_name);
            emit_u16(s, fd->scope_level);
        }
    }
    JS_FreeAtom(ctx, var_name);

    if (token_is_pseudo_keyword(s, JS_ATOM_of)) {
        break_entry.has_iterator = is_for_of = TRUE;
        break_entry.drop_count += 2;
        if (has_initializer)
            goto initializer_error;
    } else if (s->token.val == TOK_IN) {
        if (is_async)
            return js_parse_error(s, "'for await' loop should be used with 'of'");
        if (has_initializer &&
            (tok != TOK_VAR || (fd->js_mode & JS_MODE_STRICT) ||
             has_destructuring)) {
        initializer_error:
            return js_parse_error(s, "a declaration in the head of a for-%s loop can't have an initializer",
                                  is_for_of ? "of" : "in");
        }
    } else {
        return js_parse_error(s, "expected 'of' or 'in' in for control expression");
    }
    if (next_token(s))
        return -1;
    if (is_for_of) {
        if (js_parse_assign_expr(s))
            return -1;
    } else {
        if (js_parse_expr(s))
            return -1;
    }
    /* close the scope after having evaluated the expression so that
       the TDZ values are in the closures */
    close_scopes(s, s->cur_func->scope_level, block_scope_level);
    if (is_for_of) {
        if (is_async)
            emit_op(s, OP_for_await_of_start);
        else
            emit_op(s, OP_for_of_start);
        /* on stack: enum_rec */
    } else {
        emit_op(s, OP_for_in_start);
        /* on stack: enum_obj */
    }
    emit_goto(s, OP_goto, label_cont);

    if (js_parse_expect(s, ')'))
        return -1;

    if (OPTIMIZE) {
        /* move the `next` code here */
        DynBuf *bc = &s->cur_func->byte_code;
        int chunk_size = pos_expr - pos_next;
        int offset = bc->size - pos_next;
        int i;
        dbuf_realloc(bc, bc->size + chunk_size);
        dbuf_put(bc, bc->buf + pos_next, chunk_size);
        memset(bc->buf + pos_next, OP_nop, chunk_size);
        /* `next` part ends with a goto */
        s->cur_func->last_opcode_pos = bc->size - 5;
        /* relocate labels */
        for (i = label_cont; i < s->cur_func->label_count; i++) {
            LabelSlot *ls = &s->cur_func->label_slots[i];
            if (ls->pos >= pos_next && ls->pos < pos_expr)
                ls->pos += offset;
        }
    }

    emit_label(s, label_body);
    if (js_parse_statement(s))
        return -1;

    close_scopes(s, s->cur_func->scope_level, block_scope_level);

    emit_label(s, label_cont);
    if (is_for_of) {
        if (is_async) {
            /* call the next method */
            /* stack: iter_obj next catch_offset */
            emit_op(s, OP_dup3);
            emit_op(s, OP_drop);
            emit_op(s, OP_call_method);
            emit_u16(s, 0);
            /* get the result of the promise */
            emit_op(s, OP_await);
            /* unwrap the value and done values */
            emit_op(s, OP_iterator_get_value_done);
        } else {
            emit_op(s, OP_for_of_next);
            emit_u8(s, 0);
        }
    } else {
        emit_op(s, OP_for_in_next);
    }
    /* on stack: enum_rec / enum_obj value bool */
    emit_goto(s, OP_if_false, label_next);
    /* drop the undefined value from for_xx_next */
    emit_op(s, OP_drop);

    emit_label(s, label_break);
    if (is_for_of) {
        /* close and drop enum_rec */
        emit_op(s, OP_iterator_close);
    } else {
        emit_op(s, OP_drop);
    }
    pop_break_entry(s->cur_func);
    pop_scope(s);
    return 0;
}